

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

char * strlwc(char *in,char *out,uint len)

{
  int iVar1;
  uint local_28;
  uint i;
  uint len_local;
  char *out_local;
  char *in_local;
  
  if (((in == (char *)0x0) || (out == (char *)0x0)) || (len == 0)) {
    in_local = (char *)0x0;
  }
  else {
    for (local_28 = 0; in[local_28] != '\0' && local_28 < len - 1; local_28 = local_28 + 1) {
      iVar1 = tolower((int)in[local_28]);
      out[local_28] = (char)iVar1;
    }
    out[local_28] = '\0';
    in_local = out;
  }
  return in_local;
}

Assistant:

static const char * strlwc(const char * in, char *out, unsigned len)
{
    unsigned i ;

    if (in == NULL || out == NULL || len == 0) return NULL ;
    i = 0 ;
    while (in[i] != '\0' && i < len - 1) {
        out[i] = (char)tolower((int)in[i]);
        i++ ;
    }
    out[i] = '\0';
    return out ;
}